

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# doctest.h
# Opt level: O2

bool doctest::detail::parseIntOption(int argc,char **argv,char *pattern,optionType type,int *res)

{
  bool bVar1;
  int iVar2;
  int iVar3;
  long lVar4;
  char *b;
  String parsedValue;
  String local_38;
  
  String::String(&parsedValue,"");
  String::String(&local_38,"");
  bVar1 = parseOption(argc,argv,pattern,&parsedValue,&local_38);
  free(local_38.m_str);
  if (bVar1) {
    if (type == option_bool) {
      b = "1";
      iVar2 = 1;
      lVar4 = 0;
      do {
        if (lVar4 + 6 == 0x1e) goto LAB_00119d74;
        iVar3 = stricmp(parsedValue.m_str,b);
        if (iVar3 == 0) goto LAB_00119dc1;
        b = b + 5;
        iVar3 = stricmp(parsedValue.m_str,&DAT_001490b0 + lVar4);
        lVar4 = lVar4 + 6;
      } while (iVar3 != 0);
      iVar2 = 0;
LAB_00119dc1:
      *res = iVar2;
    }
    else {
      iVar2 = atoi(parsedValue.m_str);
      if (iVar2 == 0) goto LAB_00119d74;
      *res = iVar2;
    }
    bVar1 = true;
  }
  else {
LAB_00119d74:
    bVar1 = false;
  }
  free(parsedValue.m_str);
  return bVar1;
}

Assistant:

bool parseIntOption(int argc, const char* const* argv, const char* pattern, optionType type,
                        int& res) {
        String parsedValue;
        if(parseOption(argc, argv, pattern, parsedValue)) {
            if(type == 0) {
                // boolean
                const char positive[][5] = {"1", "true", "on", "yes"};  // 5 - strlen("true") + 1
                const char negative[][6] = {"0", "false", "off", "no"}; // 6 - strlen("false") + 1

                // if the value matches any of the positive/negative possibilities
                for(unsigned i = 0; i < 4; i++) {
                    if(parsedValue.compare(positive[i], true) == 0) {
                        res = 1;
                        return true;
                    }
                    if(parsedValue.compare(negative[i], true) == 0) {
                        res = 0;
                        return true;
                    }
                }
            } else {
                // integer
                int theInt = atoi(parsedValue.c_str());
                if(theInt != 0) {
                    res = theInt;
                    return true;
                }
            }
        }
        return false;
    }